

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

Point getPointFromJSON(Value *point)

{
  uint row;
  uint column;
  Point in_RAX;
  Type pGVar1;
  Point local_18;
  
  local_18 = in_RAX;
  pGVar1 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)point,"line");
  row = rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::GetUint(pGVar1);
  pGVar1 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)point,"character");
  column = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetUint(pGVar1);
  Point::Point(&local_18,row,column);
  return local_18;
}

Assistant:

Point getPointFromJSON (rapidjson::Value &point) {
    unsigned line = point["line"].GetUint();
    unsigned character = point["character"].GetUint();

    return Point { line, character };
}